

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O0

bfile_t * bf_create_m(uint8_t *buffer,uint len)

{
  bfile_t *pbVar1;
  uint32_t in_ESI;
  uint8_t *in_RDI;
  bfile_t *bfile;
  
  pbVar1 = create_bfile_t(in_ESI);
  pbVar1->buffer = in_RDI;
  pbVar1->size = (ulong)in_ESI;
  pbVar1->buffer_size = in_ESI;
  pbVar1->flags = pbVar1->flags | 0x500;
  pbVar1->ipos = (ulong)in_ESI;
  return pbVar1;
}

Assistant:

bfile_t  *
bf_create_m(
    const uint8_t * buffer,
    unsigned int len )
{
    bfile_t * bfile;
    bfile = create_bfile_t( 0 );
    bfile->buffer = (uint8_t*) buffer;
    bfile->size = len;
    bfile->buffer_size = len;
    bfile->flags |= BF_MEMBUFFER | BF_READABLE;
    bfile->ipos = len;
    return bfile;
}